

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_conv.cpp
# Opt level: O3

ImageVolume * __thiscall
LayerConv::convolution_backward
          (ImageVolume *__return_storage_ptr__,LayerConv *this,ImageVolume *dZ,ImageVolume *next_z,
          LayerSize *output_size)

{
  pointer pMVar1;
  pointer pMVar2;
  long lVar3;
  pointer pvVar4;
  long lVar5;
  pointer pvVar6;
  ulong uVar7;
  LayerConv *pLVar8;
  long lVar9;
  ulong uVar10;
  size_t f;
  undefined1 auVar11 [16];
  MatrixXd input_mat;
  ImageVolume filters_reshape;
  MatrixXd prev_z_df;
  MatrixXd conv_mat;
  MatrixXd filters_mat;
  assign_op<double,_double> local_101;
  ulong local_100;
  ImageVolume *local_f8;
  ulong local_f0;
  undefined1 local_e8 [40];
  size_t sStack_c0;
  size_t local_b8;
  ImageVolume *local_b0;
  LayerSize *local_a8;
  pointer local_a0;
  pointer local_98;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_90;
  undefined1 local_78 [16];
  double *local_68;
  MatrixXd local_60;
  MatrixXd local_48;
  
  pvVar4 = (dZ->
           super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_98 = (pointer)next_z;
  if ((dZ->
      super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pvVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"convolution_backward",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,":: fatal error: ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"empty input is not allowed!",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    (__return_storage_ptr__->
    super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    pMVar1 = (pvVar4->
             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pMVar2 = (pvVar4->
             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    f = this->__filter_size;
    lVar5 = ~(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows + output_size->rows + f;
    auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = 0x45300000;
    local_100 = (ulong)(uint)output_size->channels;
    pLVar8 = this;
    local_f8 = __return_storage_ptr__;
    local_a0 = (pointer)floor(((auVar11._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * 0.5)
    ;
    local_e8._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sStack_c0 = 0;
    local_b8 = 0;
    lVar5 = (long)pMVar2 - (long)pMVar1;
    if (lVar5 != 0) {
      lVar5 = (lVar5 >> 3) * -0x5555555555555555;
      local_f0 = lVar5 + (ulong)(lVar5 == 0);
      lVar5 = local_100 * 0x18;
      uVar10 = 0;
      local_b0 = dZ;
      local_a8 = output_size;
      do {
        local_e8._0_8_ = (_func_int **)0x0;
        local_e8._8_8_ = 0;
        local_e8._16_8_ = 0;
        if (0 < (int)local_100) {
          lVar9 = 0;
          do {
            std::
            vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::push_back((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         *)local_e8,
                        (value_type *)
                        (*(long *)((long)&(((this->__filters).
                                            super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                          )._M_impl.super__Vector_impl_data + lVar9) + uVar10 * 0x18
                        ));
            lVar9 = lVar9 + 0x18;
          } while (lVar5 != lVar9);
        }
        pLVar8 = (LayerConv *)local_e8;
        std::
        vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
        ::push_back((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                     *)(local_e8 + 0x20),(value_type *)local_e8);
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)local_e8);
        uVar10 = uVar10 + 1;
      } while (uVar10 != local_f0);
      f = this->__filter_size;
      dZ = local_b0;
      output_size = local_a8;
    }
    img2mat((MatrixXd *)local_e8,pLVar8,dZ,output_size,f,(int)(double)local_a0,1);
    filters2mat(&local_48,pLVar8,(ImageVolume *)(local_e8 + 0x20),true);
    __return_storage_ptr__ = local_f8;
    if (local_e8._16_8_ !=
        local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows)
    {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/Product.h"
                    ,0x61,
                    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                   );
    }
    pLVar8 = (LayerConv *)local_78;
    local_78._0_8_ = (MatrixXd *)local_e8;
    local_78._8_8_ = &local_48;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_60,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)local_78);
    mat2img(__return_storage_ptr__,pLVar8,&local_60,output_size);
    pvVar4 = (__return_storage_ptr__->
             super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (__return_storage_ptr__->
             super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar6 != pvVar4) {
      lVar5 = local_100 * 0x18;
      uVar10 = 0;
      do {
        if (0 < (int)local_100) {
          lVar9 = 0;
          local_f0 = uVar10;
          do {
            local_90.m_lhs =
                 (LhsNested)
                 (*(long *)&(((_Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               *)&(local_98->
                                  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar10].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                            ->_M_impl).super__Vector_impl_data + lVar9);
            local_90.m_rhs = (RhsNested)util::df_relu;
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            PlainObjectBase<Eigen::CwiseUnaryOp<double(*)(double),Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_78,
                       (DenseBase<Eigen::CwiseUnaryOp<double_(*)(double),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        *)&local_90);
            pvVar4 = (local_f8->
                     super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar3 = *(long *)&pvVar4[uVar10].
                              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                              ._M_impl.super__Vector_impl_data;
            local_90.m_lhs = (LhsNested)(lVar3 + lVar9);
            local_90.m_rhs = (RhsNested)local_78;
            if ((*(MatrixXd **)(lVar3 + 8 + lVar9) != (MatrixXd *)local_78._8_8_) ||
               (*(double **)(lVar3 + 0x10 + lVar9) != local_68)) {
              __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/CwiseBinaryOp.h"
                            ,0x6e,
                            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
                           );
            }
            Eigen::internal::
            call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::internal::assign_op<double,double>>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)
                       (*(long *)&pvVar4[uVar10].
                                  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                  ._M_impl.super__Vector_impl_data + lVar9),&local_90,&local_101);
            free((void *)local_78._0_8_);
            lVar9 = lVar9 + 0x18;
          } while (lVar5 != lVar9);
          pvVar4 = (local_f8->
                   super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pvVar6 = (local_f8->
                   super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          __return_storage_ptr__ = local_f8;
          uVar10 = local_f0;
        }
        uVar10 = uVar10 + 1;
        uVar7 = ((long)pvVar6 - (long)pvVar4 >> 3) * -0x5555555555555555;
      } while (uVar10 <= uVar7 && uVar7 - uVar10 != 0);
    }
    free(local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    free((void *)local_e8._0_8_);
    std::
    vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
    ::~vector((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
               *)(local_e8 + 0x20));
  }
  return __return_storage_ptr__;
}

Assistant:

ImageVolume LayerConv::convolution_backward(const ImageVolume& dZ, const ImageVolume& next_z, const LayerSize& output_size) {
	if (dZ.size() <= 0) {
		cout << __FUNCTION__ << ":: fatal error: " << "empty input is not allowed!" << endl;
		return ImageVolume();
	}
	auto f_channels = dZ[0].size(); // filter channels number
	auto f_num = output_size.channels; // filters number
	auto padding = floor((output_size.rows + __filter_size - dZ[0][0].rows() - 1) / 2.0);

	ImageVolume filters_reshape;
	for (auto c = 0; c < f_channels; c++) {
		LayerValues filter;
		for (auto f_ind = 0; f_ind < f_num; f_ind++)
			filter.push_back(__filters[f_ind][c]);
		filters_reshape.push_back(filter);
	}

	auto input_mat = img2mat(dZ, output_size, __filter_size, padding, 1);
	auto filters_mat = filters2mat(filters_reshape, true);
	MatrixXd conv_mat = input_mat * filters_mat;
	auto output = mat2img(conv_mat, output_size);

	// f_num is the new channels.
	for (auto img_ind = 0; img_ind < output.size(); img_ind++) {
		for (auto c = 0; c < f_num; c++) {
			MatrixXd prev_z_df = next_z[img_ind][c].unaryExpr(&util::df_relu);
			output[img_ind][c] = output[img_ind][c].cwiseProduct(prev_z_df);
		}
	}

	return output;
}